

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void msub(double *A,double *B,double *C,int rows,int cols)

{
  int local_30;
  int i;
  int N;
  int cols_local;
  int rows_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  for (local_30 = 0; local_30 < rows * cols; local_30 = local_30 + 1) {
    C[local_30] = A[local_30] - B[local_30];
  }
  return;
}

Assistant:

void msub(double* A, double* B, double* C,int rows,int cols) {
	int N,i;
	/*
	 * C = A - B . All matrices have identical dimensions rows X cols
	 */ 
	 
	N = rows * cols;
	
	#pragma omp parallel for
	for (i = 0; i < N; ++i) {
		C[i] = A[i] - B[i];
	}
}